

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall
imrt::Collimator::Collimator
          (Collimator *this,string *coord_filename,
          set<int,_std::less<int>,_std::allocator<int>_> *angles)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  ulong uVar5;
  void *this_00;
  size_type sVar6;
  string *in_RSI;
  long in_RDI;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000148;
  Collimator *in_stack_00000150;
  int angle;
  string aux;
  string line;
  ifstream coord_file;
  value_type *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffc18;
  _Self local_2a8;
  _Self local_2a0;
  string local_298 [36];
  int local_274;
  string local_270 [32];
  string local_250 [48];
  long local_220 [68];
  
  std::
  map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::map((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
         *)0x14650f);
  std::
  map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
  ::map((map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
         *)0x146528);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x146541);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x14655a);
  std::
  map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::map((map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
         *)0x146576);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x146592)
  ;
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x1465ae);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1465ca);
  std::
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::map((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
         *)0x1465e6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x146602);
  std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::map
            ((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *)
             0x14661e);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar3,_S_in);
  std::__cxx11::string::string(local_250);
  std::__cxx11::string::string(local_270);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"ERROR: unable to open instance file: ");
    poVar4 = std::operator<<(poVar4,in_RSI);
    std::operator<<(poVar4,", stopping! \n");
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"##Reading collimator coordinates info.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  while (bVar2 = std::ios::operator_cast_to_bool
                           ((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18))), bVar2) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_220,local_250);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::find(local_250,0x180460);
      std::__cxx11::string::substr((ulong)local_298,(ulong)local_250);
      std::__cxx11::string::operator=(local_270,local_298);
      std::__cxx11::string::~string(local_298);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_274 = atoi(pcVar3);
      local_2a0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     (in_stack_fffffffffffffc18,(key_type_conflict *)in_stack_fffffffffffffc10);
      local_2a8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffc08);
      bVar2 = std::operator==(&local_2a0,&local_2a8);
      if (!bVar2) {
        std::__cxx11::string::find(local_250,0x180460);
        std::__cxx11::string::length();
        std::__cxx11::string::erase((ulong)local_250,0);
        poVar4 = std::operator<<((ostream *)&std::cout,"##  ");
        poVar4 = std::operator<<(poVar4,local_250);
        poVar4 = std::operator<<(poVar4," a:");
        this_00 = (void *)std::ostream::operator<<(poVar4,local_274);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        std::make_pair<int&,std::__cxx11::string&>
                  ((int *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
        std::
        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1469a9);
      }
    }
  }
  std::ifstream::close();
  sVar6 = std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(in_RDI + 0x120));
  *(int *)(in_RDI + 0x118) = (int)sVar6;
  initializeCoordinates(in_stack_00000150,in_stack_00000148);
  poVar4 = std::operator<<((ostream *)&std::cout,"##  Read ");
  sVar6 = std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(in_RDI + 0x120));
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar6);
  poVar4 = std::operator<<(poVar4," files.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_250);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

Collimator::Collimator(string coord_filename, set<int> angles) {
    ifstream coord_file(coord_filename.c_str(), ios::in);
    string line, aux;
    int angle;

    if (! coord_file)
      cerr << "ERROR: unable to open instance file: " << coord_filename << ", stopping! \n";

    cout << "##Reading collimator coordinates info." << endl;
    while (coord_file) {
      getline(coord_file, line);
      if (line.empty()) continue;
      aux   = line.substr(0, line.find(delimiter));
      angle = atoi(aux.c_str());
      if (angles.find(angle) == angles.end()) continue;
      line.erase(0, line.find(delimiter) + delimiter.length());
      cout << "##  " << line << " a:" << angle << endl;
      coord_files.push_back(make_pair(angle,line));
    }
    coord_file.close();
    n_angles=coord_files.size();
    initializeCoordinates(coord_files);
    cout << "##  Read " << coord_files.size()<< " files."<< endl;
  }